

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::
     parallel_for<Omega_h::filter_graph_nodes(Omega_h::Graph,Omega_h::Read<signed_char>)::__1>
               (LO n,type *f,char *name)

{
  undefined1 local_b0 [8];
  type f2;
  IntIterator last;
  IntIterator first;
  char *name_local;
  type *f_local;
  LO n_local;
  
  f2.new_edge2new_node.shared_alloc_.direct_ptr._4_4_ = 0;
  f2.new_edge2new_node.shared_alloc_.direct_ptr._0_4_ = n;
  filter_graph_nodes(Omega_h::Graph,Omega_h::Read<signed_char>)::$_1::__1((__1 *)local_b0,f);
  for_each<Omega_h::IntIterator,Omega_h::filter_graph_nodes(Omega_h::Graph,Omega_h::Read<signed_char>)::__1>
            (f2.new_edge2new_node.shared_alloc_.direct_ptr._4_4_,
             f2.new_edge2new_node.shared_alloc_.direct_ptr._0_4_,(type *)local_b0);
  filter_graph_nodes(Omega_h::Graph,Omega_h::Read<signed_char>)::$_1::~__1((__1 *)local_b0);
  return;
}

Assistant:

void parallel_for(LO n, T const& f, char const* name = "") {
#if defined(OMEGA_H_USE_KOKKOS)
  if (n > 0) Kokkos::parallel_for(name, policy(n), f);
#else
  (void)name;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  auto f2 = f;
  ::Omega_h::for_each(first, last, std::move(f2));
#endif
}